

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_random(lua_State *L)

{
  int iVar1;
  RanState *state_00;
  unsigned_long x;
  lua_Unsigned lVar2;
  lua_Number n;
  unsigned_long rv;
  RanState *state;
  lua_Unsigned p;
  lua_Integer up;
  lua_Integer low;
  lua_State *L_local;
  
  state_00 = (RanState *)lua_touserdata(L,-0xf4629);
  x = nextrand((unsigned_long *)state_00);
  iVar1 = lua_gettop(L);
  if (iVar1 == 0) {
    n = I2d(x);
    lua_pushnumber(L,n);
  }
  else {
    if (iVar1 == 1) {
      up = 1;
      p = luaL_checkinteger(L,1);
      if (p == 0) {
        lua_pushinteger(L,x);
        return 1;
      }
    }
    else {
      if (iVar1 != 2) {
        iVar1 = luaL_error(L,"wrong number of arguments");
        return iVar1;
      }
      up = luaL_checkinteger(L,1);
      p = luaL_checkinteger(L,2);
    }
    if ((long)p < up) {
      luaL_argerror(L,1,"interval is empty");
    }
    lVar2 = project(x,p - up,state_00);
    lua_pushinteger(L,lVar2 + up);
  }
  return 1;
}

Assistant:

static int math_random (lua_State *L) {
  lua_Integer low, up;
  lua_Unsigned p;
  RanState *state = (RanState *)lua_touserdata(L, lua_upvalueindex(1));
  Rand64 rv = nextrand(state->s);  /* next pseudo-random value */
  switch (lua_gettop(L)) {  /* check number of arguments */
    case 0: {  /* no arguments */
      lua_pushnumber(L, I2d(rv));  /* float between 0 and 1 */
      return 1;
    }
    case 1: {  /* only upper limit */
      low = 1;
      up = luaL_checkinteger(L, 1);
      if (up == 0) {  /* single 0 as argument? */
        lua_pushinteger(L, I2UInt(rv));  /* full random integer */
        return 1;
      }
      break;
    }
    case 2: {  /* lower and upper limits */
      low = luaL_checkinteger(L, 1);
      up = luaL_checkinteger(L, 2);
      break;
    }
    default: return luaL_error(L, "wrong number of arguments");
  }
  /* random integer in the interval [low, up] */
  luaL_argcheck(L, low <= up, 1, "interval is empty");
  /* project random integer into the interval [0, up - low] */
  p = project(I2UInt(rv), (lua_Unsigned)up - (lua_Unsigned)low, state);
  lua_pushinteger(L, p + (lua_Unsigned)low);
  return 1;
}